

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseUtils.h
# Opt level: O1

FILE * Minisat::open_pipe(char *fmt,char *path,char *mode)

{
  int iVar1;
  bool bVar2;
  char *__dest;
  int *piVar3;
  size_t sVar4;
  FILE *pFVar5;
  undefined8 uVar6;
  size_t sVar7;
  
  for (sVar7 = 0; (fmt[sVar7] & 0xdfU) != 0; sVar7 = sVar7 + 1) {
  }
  __dest = (char *)malloc(sVar7 + 1);
  if (__dest == (char *)0x0) {
    piVar3 = __errno_location();
    iVar1 = *piVar3;
joined_r0x001089a6:
    if (iVar1 == 0xc) {
      uVar6 = __cxa_allocate_exception(1);
      __cxa_throw(uVar6,&OutOfMemoryException::typeinfo,0);
    }
    pFVar5 = (FILE *)0x0;
  }
  else {
    strncpy(__dest,fmt,sVar7);
    __dest[sVar7] = '\0';
    bVar2 = find_executable(__dest);
    if (bVar2) {
      free(__dest);
      sVar7 = strlen(fmt);
      sVar4 = strlen(path);
      __dest = (char *)malloc(sVar7 + sVar4 + 1);
      if (__dest == (char *)0x0) {
        piVar3 = __errno_location();
        iVar1 = *piVar3;
        goto joined_r0x001089a6;
      }
      sprintf(__dest,fmt,path);
      pFVar5 = popen(__dest,mode);
    }
    else {
      pFVar5 = (FILE *)0x0;
      fprintf(_stderr,"c WARNING: failed to find executable %s\n",__dest);
    }
    free(__dest);
  }
  return (FILE *)pFVar5;
}

Assistant:

inline FILE *open_pipe(const char *fmt, const char *path, const char *mode)
{
    size_t name_len = 0;
    while (fmt[name_len] && fmt[name_len] != ' ') name_len++;
    char *name = (char *)xrealloc(NULL, name_len + 1);
    if (!name) return 0;
    strncpy(name, fmt, name_len);
    name[name_len] = 0;
    bool found = find_executable(name);
    if (!found) fprintf(stderr, "c WARNING: failed to find executable %s\n", name);
    free(name);
    if (!found) return 0;
    char *cmd = (char *)xrealloc(NULL, strlen(fmt) + strlen(path) + 1);
    if (!cmd) return 0;
    sprintf(cmd, fmt, path);
    FILE *res = popen(cmd, mode);
    free(cmd);
    return res;
}